

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeThumbAddSpecialReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[(byte)(Insn >> 8) & 7]);
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 != 0xa93) {
    if (uVar1 != 0xa8d) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateReg0(Inst,0xc);
  }
  MCOperand_CreateImm0(Inst,(ulong)Insn & 0xff);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThumbAddSpecialReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned dst = fieldFromInstruction_2(Insn, 8, 3);
	unsigned imm = fieldFromInstruction_2(Insn, 0, 8);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, dst, Address, Decoder)))
		return MCDisassembler_Fail;

	switch(MCInst_getOpcode(Inst)) {
		default:
			return MCDisassembler_Fail;
		case ARM_tADR:
			break; // tADR does not explicitly represent the PC as an operand.
		case ARM_tADDrSPi:
			MCOperand_CreateReg0(Inst, ARM_SP);
			break;
	}

	MCOperand_CreateImm0(Inst, imm);
	return S;
}